

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

int Ivy_CutTruthPrint(Ivy_Man_t *p,Ivy_Cut_t *pCut,uint uTruth)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Vec_Ptr_t *vArray;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  sVar1 = pCut->nSize;
  iVar7 = 0;
  iVar8 = 0;
  if (0 < (long)sVar1) {
    lVar4 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(byte)pCut->pArray[lVar4];
      lVar4 = lVar4 + 1;
    } while (sVar1 != lVar4);
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vArray->pArray = ppvVar5;
  if (0 < sVar1) {
    lVar4 = 0;
    iVar7 = 0;
    do {
      uVar2 = pCut->pArray[lVar4] >> 8;
      if (((int)uVar2 < 0) || (p->vObjs->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ivy_ObjCollectFanouts(p,(Ivy_Obj_t *)p->vObjs->pArray[uVar2],vArray);
      if (0 < (long)vArray->nSize) {
        lVar6 = 0;
        do {
          if (vArray->pArray[lVar6] == (void *)0x0) break;
          if ((*(uint *)((long)vArray->pArray[lVar6] + 8) & 0xf) == 4) {
            iVar7 = iVar7 + 1;
            break;
          }
          lVar6 = lVar6 + 1;
        } while (vArray->nSize != lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pCut->nSize);
  }
  iVar3 = 0;
  if (iVar7 < iVar8) {
    iVar3 = (iVar8 - iVar7) * 2;
  }
  return iVar3;
}

Assistant:

int Ivy_CutTruthPrint( Ivy_Man_t * p, Ivy_Cut_t * pCut, unsigned uTruth )
{
    Vec_Ptr_t * vArray;
    Ivy_Obj_t * pObj, * pFanout;
    int nLatches = 0;
    int nPresent = 0;
    int i, k;
    int fVerbose = 0;

    if ( fVerbose )
        printf( "Trying cut : {" );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        if ( fVerbose )
            printf( " %6d(%d)", Ivy_LeafId(pCut->pArray[i]), Ivy_LeafLat(pCut->pArray[i]) );
        nLatches += Ivy_LeafLat(pCut->pArray[i]);
    }
    if ( fVerbose )
        printf( " }   " );
    if ( fVerbose )
        printf( "Latches = %d. ", nLatches );

    // check if there are latches on the fanout edges
    vArray = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        pObj = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[i]) );
        Ivy_ObjForEachFanout( p, pObj, vArray, pFanout, k )
        {
            if ( Ivy_ObjIsLatch(pFanout) )
            {
                nPresent++;
                break;
            }
        }
    }
    Vec_PtrSize( vArray );
    if ( fVerbose )
    {
        printf( "Present = %d. ", nPresent );
        if ( nLatches > nPresent )
            printf( "Clauses = %d. ", 2*(nLatches - nPresent) );
        printf( "\n" );
    }
    return ( nLatches > nPresent ) ? 2*(nLatches - nPresent) : 0;
}